

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.c
# Opt level: O1

_Bool CrawlNumbers(Lexer *lexer)

{
  int *piVar1;
  int iVar2;
  int iVar3;
  ushort *puVar4;
  _Bool _Var5;
  int iVar6;
  long lVar7;
  ushort **ppuVar8;
  char cVar9;
  char cVar10;
  
  iVar2 = lexer->length;
  iVar3 = (lexer->tracker).currentTokenPosition;
  cVar9 = -1;
  cVar10 = -1;
  if (iVar3 < iVar2) {
    cVar10 = lexer->rawSourceCode[iVar3];
  }
  lVar7 = (long)iVar3 + 1;
  iVar6 = (int)lVar7;
  (lexer->tracker).currentTokenPosition = iVar6;
  if (iVar6 < iVar2) {
    cVar9 = lexer->rawSourceCode[lVar7];
  }
  (lexer->tracker).currentTokenPosition = iVar3;
  ppuVar8 = __ctype_b_loc();
  puVar4 = *ppuVar8;
  _Var5 = (_Bool)(cVar10 == '.' | (*(byte *)((long)puVar4 + (long)cVar10 * 2 + 1) & 8) >> 3);
  if (_Var5 == true) {
    (lexer->tracker).tokenStart = iVar3;
    if ((cVar9 == '.') || ((puVar4[cVar9] & 0x800) != 0)) {
      lVar7 = (long)(lexer->tracker).currentTokenPosition + 1;
      do {
        (lexer->tracker).currentTokenPosition = (int)lVar7;
        cVar10 = -1;
        if (lVar7 < iVar2) {
          cVar10 = lexer->rawSourceCode[lVar7];
        }
        (lexer->tracker).currentTokenPosition = (int)lVar7;
        lVar7 = lVar7 + 1;
      } while ((cVar10 == '.') || ((puVar4[cVar10] & 0x800) != 0));
    }
    else {
      piVar1 = &(lexer->tracker).currentTokenPosition;
      *piVar1 = *piVar1 + 1;
    }
    (lexer->tracker).tokenEnd = (lexer->tracker).currentTokenPosition;
  }
  return _Var5;
}

Assistant:

bool CrawlNumbers(Lexer* lexer){
	char currentChar = GetCurrentCharacter(lexer);
	char nextChar = PeekNextCharacter(lexer);
	bool isTrailingPeriod = currentChar == '.';
	if (isdigit(currentChar) || isTrailingPeriod){
		SetTokenStart(lexer);
		bool inside = false;
		while (true){
			if (!isdigit(nextChar) && nextChar != '.') break;
			nextChar = PeekNextCharacter(lexer);
			GetNextCharacter(lexer);
			inside = true;
		}
		if (!inside) GetNextCharacter(lexer);
		SetTokenEnd(lexer);
		return true;
	}
	return false;
}